

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O0

int deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::genMaxSSBlocksSource
              (NegativeTestContext *ctx,GLenum glShaderType,ProgramSources *sources)

{
  undefined4 uVar1;
  ShaderType SVar2;
  GLenum in_R8D;
  undefined1 local_48 [8];
  string shaderSrc;
  int maxSSBlocks;
  ProgramSources *sources_local;
  GLenum glShaderType_local;
  NegativeTestContext *ctx_local;
  
  shaderSrc.field_2._12_4_ = getMaxSSBlockSize(ctx,glShaderType);
  NegativeTestShared::(anonymous_namespace)::genBlockSource_abi_cxx11_
            ((string *)local_48,(_anonymous_namespace_ *)ctx,
             (NegativeTestContext *)(long)(int)shaderSrc.field_2._12_4_,(ulong)glShaderType,in_R8D);
  SVar2 = getGLUShaderType(glShaderType);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources->sources + SVar2,(string *)local_48);
  uVar1 = shaderSrc.field_2._12_4_;
  std::__cxx11::string::~string((string *)local_48);
  return uVar1;
}

Assistant:

int genMaxSSBlocksSource (NegativeTestContext& ctx, glw::GLenum glShaderType, glu::ProgramSources& sources)
{
	int		maxSSBlocks				= getMaxSSBlockSize(ctx, glShaderType);
	const	std::string shaderSrc	= genBlockSource(ctx, (maxSSBlocks), glShaderType);

	sources.sources[getGLUShaderType(glShaderType)].push_back(shaderSrc);

	return maxSSBlocks;
}